

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

void showVersion(FILE *errStream,char *name)

{
  int iVar1;
  char *name_local;
  FILE *errStream_local;
  
  fprintf((FILE *)errStream,"%s: using libxml version %s\n",name,_xmlParserVersion);
  fprintf((FILE *)errStream,"   compiled with: ");
  iVar1 = xmlHasFeature(1);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"Threads ");
  }
  iVar1 = xmlHasFeature(2);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"Tree ");
  }
  iVar1 = xmlHasFeature(3);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"Output ");
  }
  iVar1 = xmlHasFeature(4);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"Push ");
  }
  iVar1 = xmlHasFeature(5);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"Reader ");
  }
  iVar1 = xmlHasFeature(6);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"Patterns ");
  }
  iVar1 = xmlHasFeature(7);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"Writer ");
  }
  iVar1 = xmlHasFeature(8);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"SAXv1 ");
  }
  iVar1 = xmlHasFeature(10);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"HTTP ");
  }
  iVar1 = xmlHasFeature(0xb);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"DTDValid ");
  }
  iVar1 = xmlHasFeature(0xc);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"HTML ");
  }
  iVar1 = xmlHasFeature(0xd);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"Legacy ");
  }
  iVar1 = xmlHasFeature(0xe);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"C14N ");
  }
  iVar1 = xmlHasFeature(0xf);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"Catalog ");
  }
  iVar1 = xmlHasFeature(0x10);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"XPath ");
  }
  iVar1 = xmlHasFeature(0x11);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"XPointer ");
  }
  iVar1 = xmlHasFeature(0x12);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"XInclude ");
  }
  iVar1 = xmlHasFeature(0x13);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"Iconv ");
  }
  iVar1 = xmlHasFeature(0x20);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"ICU ");
  }
  iVar1 = xmlHasFeature(0x14);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"ISO8859X ");
  }
  iVar1 = xmlHasFeature(0x15);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"Unicode ");
  }
  iVar1 = xmlHasFeature(0x16);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"Regexps ");
  }
  iVar1 = xmlHasFeature(0x17);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"Automata ");
  }
  iVar1 = xmlHasFeature(0x18);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"Expr ");
  }
  iVar1 = xmlHasFeature(0x22);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"RelaxNG ");
  }
  iVar1 = xmlHasFeature(0x19);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"Schemas ");
  }
  iVar1 = xmlHasFeature(0x1a);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"Schematron ");
  }
  iVar1 = xmlHasFeature(0x1b);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"Modules ");
  }
  iVar1 = xmlHasFeature(0x1c);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"Debug ");
  }
  iVar1 = xmlHasFeature(0x1f);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"Zlib ");
  }
  iVar1 = xmlHasFeature(0x21);
  if (iVar1 != 0) {
    fprintf((FILE *)errStream,"Lzma ");
  }
  fprintf((FILE *)errStream,"\n");
  return;
}

Assistant:

static void showVersion(FILE *errStream, const char *name) {
    fprintf(errStream, "%s: using libxml version %s\n", name, xmlParserVersion);
    fprintf(errStream, "   compiled with: ");
    if (xmlHasFeature(XML_WITH_THREAD)) fprintf(errStream, "Threads ");
    if (xmlHasFeature(XML_WITH_TREE)) fprintf(errStream, "Tree ");
    if (xmlHasFeature(XML_WITH_OUTPUT)) fprintf(errStream, "Output ");
    if (xmlHasFeature(XML_WITH_PUSH)) fprintf(errStream, "Push ");
    if (xmlHasFeature(XML_WITH_READER)) fprintf(errStream, "Reader ");
    if (xmlHasFeature(XML_WITH_PATTERN)) fprintf(errStream, "Patterns ");
    if (xmlHasFeature(XML_WITH_WRITER)) fprintf(errStream, "Writer ");
    if (xmlHasFeature(XML_WITH_SAX1)) fprintf(errStream, "SAXv1 ");
    if (xmlHasFeature(XML_WITH_HTTP)) fprintf(errStream, "HTTP ");
    if (xmlHasFeature(XML_WITH_VALID)) fprintf(errStream, "DTDValid ");
    if (xmlHasFeature(XML_WITH_HTML)) fprintf(errStream, "HTML ");
    if (xmlHasFeature(XML_WITH_LEGACY)) fprintf(errStream, "Legacy ");
    if (xmlHasFeature(XML_WITH_C14N)) fprintf(errStream, "C14N ");
    if (xmlHasFeature(XML_WITH_CATALOG)) fprintf(errStream, "Catalog ");
    if (xmlHasFeature(XML_WITH_XPATH)) fprintf(errStream, "XPath ");
    if (xmlHasFeature(XML_WITH_XPTR)) fprintf(errStream, "XPointer ");
    if (xmlHasFeature(XML_WITH_XINCLUDE)) fprintf(errStream, "XInclude ");
    if (xmlHasFeature(XML_WITH_ICONV)) fprintf(errStream, "Iconv ");
    if (xmlHasFeature(XML_WITH_ICU)) fprintf(errStream, "ICU ");
    if (xmlHasFeature(XML_WITH_ISO8859X)) fprintf(errStream, "ISO8859X ");
    if (xmlHasFeature(XML_WITH_UNICODE)) fprintf(errStream, "Unicode ");
    if (xmlHasFeature(XML_WITH_REGEXP)) fprintf(errStream, "Regexps ");
    if (xmlHasFeature(XML_WITH_AUTOMATA)) fprintf(errStream, "Automata ");
    if (xmlHasFeature(XML_WITH_EXPR)) fprintf(errStream, "Expr ");
    if (xmlHasFeature(XML_WITH_RELAXNG)) fprintf(errStream, "RelaxNG ");
    if (xmlHasFeature(XML_WITH_SCHEMAS)) fprintf(errStream, "Schemas ");
    if (xmlHasFeature(XML_WITH_SCHEMATRON)) fprintf(errStream, "Schematron ");
    if (xmlHasFeature(XML_WITH_MODULES)) fprintf(errStream, "Modules ");
    if (xmlHasFeature(XML_WITH_DEBUG)) fprintf(errStream, "Debug ");
    if (xmlHasFeature(XML_WITH_ZLIB)) fprintf(errStream, "Zlib ");
    if (xmlHasFeature(XML_WITH_LZMA)) fprintf(errStream, "Lzma ");
    fprintf(errStream, "\n");
}